

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

bool __thiscall
kj::ArrayPtr<char_const>::operator==
          (ArrayPtr<char_const> *this,ArrayPtr<const_unsigned_char> *other)

{
  char *pcVar1;
  byte *pbVar2;
  size_t sVar3;
  bool bVar4;
  
  if (*(size_t *)(this + 8) != other->size_) {
    return false;
  }
  sVar3 = 0;
  do {
    bVar4 = *(size_t *)(this + 8) == sVar3;
    if (bVar4) {
      return bVar4;
    }
    pcVar1 = (char *)(*(long *)this + sVar3);
    pbVar2 = other->ptr + sVar3;
    sVar3 = sVar3 + 1;
  } while ((int)*pcVar1 == (uint)*pbVar2);
  return bVar4;
}

Assistant:

inline constexpr bool operator==(const ArrayPtr<U>& other) const {
    if (size_ != other.size()) return false;
    for (size_t i = 0; i < size_; i++) {
      if (ptr[i] != other[i]) return false;
    }
    return true;
  }